

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template-parser.c
# Opt level: O3

bc_slist_t * blogc_template_parse(char *src,size_t src_len,bc_error_t **err)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  size_t sVar7;
  _Bool _Var8;
  bool bVar9;
  char *pcVar10;
  bc_error_t *pbVar11;
  size_t __n;
  uint uVar12;
  char *pcVar13;
  size_t current;
  int iVar14;
  bool bVar15;
  int local_c4;
  ulong local_c0;
  size_t local_b0;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  bc_slist_t *local_88;
  ulong local_78;
  ulong local_70;
  size_t local_60;
  int *local_58;
  undefined8 local_40;
  
  if ((err != (bc_error_t **)0x0) && (*err == (bc_error_t *)0x0)) {
    local_c4 = 0xb;
    uVar12 = 1;
    local_c0 = 0;
    local_a0 = 0;
    local_b0 = 0;
    local_90 = 0;
    local_60 = 0;
    local_70 = 0;
    local_98 = 0;
    local_78 = 0;
    bVar9 = false;
    bVar4 = false;
    bVar5 = false;
    local_88 = (bc_slist_t *)0x0;
    local_58 = (int *)0x0;
    bVar3 = false;
    local_40 = 0;
    bVar6 = false;
    current = 0;
    do {
      if (src_len == current) {
        if (uVar12 == 0xd) {
          pbVar11 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,local_60,
                                    "Found an open double-quoted string.");
        }
        else if (local_98 == 0) {
          if (bVar6) {
            pcVar13 = "An open block was not closed!";
          }
          else {
            if (!bVar4) {
              return local_88;
            }
            pcVar13 = "An open \'foreach\' statement was not closed!";
          }
          pbVar11 = bc_error_new(BLOGC_ERROR_TEMPLATE_PARSER,pcVar13);
        }
        else {
          pbVar11 = bc_error_new_printf(BLOGC_ERROR_TEMPLATE_PARSER,
                                        "%d open \'if\', \'ifdef\' and/or \'ifndef\' statements were not closed!"
                                       );
        }
        *err = pbVar11;
        if (pbVar11 == (bc_error_t *)0x0) {
          return local_88;
        }
        break;
      }
      if (0x15 < uVar12 - 1) goto LAB_001058c9;
      cVar1 = src[current];
      iVar14 = (int)cVar1;
      sVar7 = local_a0;
      switch(uVar12) {
      case 1:
        if (src_len - 1 == current) {
          local_58 = (int *)bc_malloc(0x20);
          *local_58 = local_c4;
          pcVar13 = bc_strndup(src + local_c0,src_len - local_c0);
          if (bVar3) {
            pcVar10 = bc_str_lstrip(pcVar13);
            pcVar10 = bc_strdup(pcVar10);
            *(char **)(local_58 + 2) = pcVar10;
            free(pcVar13);
            bVar3 = false;
          }
          else {
            *(char **)(local_58 + 2) = pcVar13;
          }
          local_58[1] = 0;
          local_58[4] = 0;
          local_58[5] = 0;
          local_88 = bc_slist_append(local_88,local_58);
        }
        if (cVar1 == '{') {
          local_a0 = current;
        }
        uVar12 = (cVar1 == '{') + 1;
        break;
      case 2:
        if (cVar1 == '%') {
          uVar12 = 4;
        }
        else {
          uVar12 = 1;
          if (cVar1 != '{') break;
          uVar12 = 0x13;
        }
        if (local_c0 <= local_a0 && local_a0 - local_c0 != 0) {
          local_58 = (int *)bc_malloc(0x20);
          *local_58 = local_c4;
          pcVar13 = bc_strndup(src + local_c0,local_a0 - local_c0);
          if (bVar3) {
            pcVar10 = bc_str_lstrip(pcVar13);
            pcVar10 = bc_strdup(pcVar10);
            *(char **)(local_58 + 2) = pcVar10;
            free(pcVar13);
            bVar3 = false;
          }
          else {
            *(char **)(local_58 + 2) = pcVar13;
          }
          local_58[1] = 0;
          local_58[4] = 0;
          local_58[5] = 0;
          local_88 = bc_slist_append(local_88,local_58);
        }
        break;
      case 3:
switchD_00104d0f_caseD_3:
        _Var8 = bc_isspace(iVar14);
        uVar12 = 3;
        if (!_Var8) {
          if (0x19 < (byte)(cVar1 + 0x9fU)) {
            if (cVar1 == '-') {
              pcVar13 = "Invalid statement syntax. Duplicated whitespace cleaner before statement.";
            }
            else {
              pcVar13 = "Invalid statement syntax. Must begin with lowercase letter.";
            }
            goto LAB_001058bf;
          }
          uVar12 = 5;
          local_c0 = current;
        }
        break;
      case 4:
        if (cVar1 != '-') goto switchD_00104d0f_caseD_3;
        uVar12 = 3;
        if (local_58 == (int *)0x0) {
          local_58 = (int *)0x0;
        }
        else if (*local_58 == 0xb) {
          pcVar13 = bc_str_rstrip(*(char **)(local_58 + 2));
          *(char **)(local_58 + 2) = pcVar13;
        }
        break;
      case 5:
        uVar12 = 5;
        if ((byte)(cVar1 + 0x9fU) < 0x1a) break;
        _Var8 = bc_isspace(iVar14);
        if (!_Var8) goto switchD_00104e67_caseD_3;
        switch(current - local_c0) {
        case 2:
          if ((byte)src[local_c0] - 0x69 == 0) {
            iVar14 = 0x66 - (uint)(byte)src[local_c0 + 1];
          }
          else {
            iVar14 = -((byte)src[local_c0] - 0x69);
          }
          if (iVar14 != 0) goto switchD_00104e67_caseD_3;
          local_c4 = 3;
LAB_00105a40:
          local_98 = local_98 + 1;
          uVar12 = 8;
          bVar9 = false;
          local_c0 = current;
          break;
        case 4:
          iVar14 = strncmp("else",src + local_c0,4);
          if (iVar14 != 0) goto switchD_00104e67_caseD_3;
          bVar15 = local_98 == 0;
          if (bVar6) {
            bVar15 = local_98 <= local_78;
          }
          if (bVar15) {
            pcVar13 = 
            "\'else\' statement without an open \'if\', \'ifdef\' or \'ifndef\' statement.";
            goto LAB_001058bf;
          }
          if (bVar9) {
            pbVar11 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,current,
                                      "More than one \'else\' statement for an open \'if\', \'ifdef\' or \'ifndef\' statement."
                                     );
            *err = pbVar11;
          }
          else {
            local_c4 = 4;
            uVar12 = 0x11;
          }
          bVar9 = true;
          break;
        case 5:
          pcVar13 = src + local_c0;
          iVar14 = strncmp("block",pcVar13,5);
          if (iVar14 == 0) {
            if (bVar6) {
              pcVar13 = "Blocks can\'t be nested.";
              goto LAB_001058bf;
            }
            local_c4 = 8;
            uVar12 = 6;
            local_78 = local_98;
            local_c0 = current;
            bVar5 = bVar4;
          }
          else {
            iVar14 = strncmp("ifdef",pcVar13,5);
            if (iVar14 == 0) {
              local_c4 = 1;
              goto LAB_00105a40;
            }
            iVar14 = strncmp("endif",pcVar13,5);
            if (iVar14 != 0) goto switchD_00104e67_caseD_3;
            bVar15 = local_98 == 0;
            if (bVar6) {
              bVar15 = local_98 <= local_78;
            }
            if (bVar15) {
              pcVar13 = 
              "\'endif\' statement without an open \'if\', \'ifdef\' or \'ifndef\' statement.";
              goto LAB_001058bf;
            }
            local_98 = local_98 - 1;
            local_c4 = 5;
            uVar12 = 0x11;
            bVar9 = false;
          }
          break;
        case 6:
          iVar14 = strncmp("ifndef",src + local_c0,6);
          if (iVar14 == 0) {
            local_c4 = 2;
            goto LAB_00105a40;
          }
        default:
switchD_00104e67_caseD_3:
          pcVar13 = 
          "Invalid statement type: Allowed types are: \'block\', \'endblock\', \'if\', \'ifdef\', \'ifndef\', \'else\', \'endif\', \'foreach\' and \'endforeach\'."
          ;
LAB_001058bf:
          pbVar11 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,current,pcVar13);
LAB_001058c6:
          *err = pbVar11;
          break;
        case 7:
          iVar14 = strncmp("foreach",src + local_c0,7);
          if (iVar14 != 0) goto switchD_00104e67_caseD_3;
          if (bVar4) {
            pcVar13 = "\'foreach\' statements can\'t be nested.";
            goto LAB_001058bf;
          }
          local_c4 = 6;
          uVar12 = 0xf;
          bVar4 = true;
          local_c0 = current;
          break;
        case 8:
          iVar14 = strncmp("endblock",src + local_c0,8);
          if (iVar14 != 0) goto switchD_00104e67_caseD_3;
          if (!bVar6) {
            pcVar13 = "\'endblock\' statement without an open \'block\' statement.";
            goto LAB_001058bf;
          }
          if (local_98 - local_78 == 0) {
            if ((bVar5) || (!bVar4)) {
              bVar6 = false;
              local_78 = local_98;
              uVar12 = 0x11;
              local_c4 = 9;
            }
            else {
              pbVar11 = bc_error_new_printf(BLOGC_ERROR_TEMPLATE_PARSER,
                                            "An open \'foreach\' statement was not closed inside a \'%s\' block!"
                                            ,local_40);
              *err = pbVar11;
              local_78 = local_98;
            }
            break;
          }
          pbVar11 = bc_error_new_printf(BLOGC_ERROR_TEMPLATE_PARSER,
                                        "%d open \'if\', \'ifdef\' and/or \'ifndef\' statements were not closed inside a \'%s\' block!"
                                        ,local_98 - local_78,local_40);
          goto LAB_001058c6;
        case 10:
          iVar14 = strncmp("endforeach",src + local_c0,10);
          if (iVar14 != 0) goto switchD_00104e67_caseD_3;
          if (((bVar6) && (bVar5)) || (!bVar4)) {
            pcVar13 = "\'endforeach\' statement without an open \'foreach\' statement.";
            goto LAB_001058bf;
          }
          local_c4 = 7;
          uVar12 = 0x11;
          bVar4 = false;
        }
        break;
      case 6:
        _Var8 = bc_isspace(iVar14);
        uVar12 = 6;
        if (_Var8) break;
        if ((byte)(cVar1 + 0x9fU) < 0x1a) {
          uVar12 = 7;
          local_c0 = current;
          break;
        }
        pcVar13 = "Invalid block syntax. Must begin with lowercase letter.";
        goto LAB_001058bf;
      case 7:
        uVar12 = 7;
        if (cVar1 == '_' || (byte)(cVar1 + 0x9fU) < 0x1a) break;
        _Var8 = bc_isspace(iVar14);
        if (!_Var8) goto switchD_00105180_caseD_6;
        switch(current - local_c0) {
        case 5:
          __n = 5;
          pcVar13 = "entry";
          break;
        default:
          goto switchD_00105180_caseD_6;
        case 7:
          __n = 7;
          pcVar13 = "listing";
          break;
        case 0xc:
          __n = 0xc;
          pcVar13 = "listing_once";
          break;
        case 0xd:
          iVar14 = strncmp("listing_empty",src + local_c0,0xd);
          if ((iVar14 == 0) || (iVar14 = strncmp("listing_entry",src + local_c0,0xd), iVar14 == 0))
          {
            uVar12 = 0x11;
            bVar6 = true;
            local_a0 = current;
            goto LAB_001058c9;
          }
          goto switchD_00105180_caseD_6;
        }
        iVar14 = strncmp(pcVar13,src + local_c0,__n);
        if (iVar14 == 0) {
          bVar6 = true;
          uVar12 = 0x11;
          local_a0 = current;
          break;
        }
switchD_00105180_caseD_6:
        pcVar13 = 
        "Invalid block type. Allowed types are: \'entry\', \'listing\', \'listing_once\', \'listing_empty\' and \'listing_entry\'."
        ;
        goto LAB_001058bf;
      case 8:
        _Var8 = bc_isspace(iVar14);
        uVar12 = 8;
        if (!_Var8) {
          if (0x19 < (byte)(cVar1 + 0xbfU)) {
LAB_00105290:
            pcVar13 = "Invalid variable name. Must begin with uppercase letter.";
            goto LAB_001058bf;
          }
          uVar12 = 9;
          local_c0 = current;
        }
        break;
      case 9:
        uVar12 = 9;
        if ((0x19 < (byte)(cVar1 + 0xbfU)) && (cVar1 != '_' && 9 < (byte)(cVar1 - 0x30U))) {
          _Var8 = bc_isspace(iVar14);
          if (!_Var8) {
LAB_001054e7:
            pcVar13 = "Invalid variable name. Must be uppercase letter, number or \'_\'.";
            goto LAB_001058bf;
          }
          uVar12 = 0x11;
          local_a0 = current;
          if (local_c4 == 3) {
            uVar12 = 10;
          }
        }
        break;
      case 10:
        _Var8 = bc_isspace(iVar14);
        if (!_Var8) {
          local_b0 = current;
        }
        uVar12 = _Var8 ^ 0xb;
        break;
      case 0xb:
        _Var8 = bc_isspace(iVar14);
        if (_Var8) {
          local_90 = current;
        }
        uVar12 = _Var8 + 0xb;
        break;
      case 0xc:
        _Var8 = bc_isspace(iVar14);
        uVar12 = 0xc;
        if (!_Var8) {
          if ((byte)(cVar1 + 0xbfU) < 0x1a) {
            uVar12 = 0xe;
            local_60 = current;
          }
          else if (cVar1 == '\"') {
            uVar12 = 0xd;
            local_60 = current;
          }
          else {
            pbVar11 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,current,
                                      "Invalid \'if\' operand. Must be double-quoted static string or variable."
                                     );
            *err = pbVar11;
LAB_0010593b:
            local_b0 = 0;
            local_90 = 0;
          }
        }
        break;
      case 0xd:
        uVar12 = 0xd;
        if (cVar1 == '\"') {
          if (src[current - 1] != '\\') {
            local_70 = current + 1;
          }
          uVar12 = (uint)(src[current - 1] != '\\') * 4 + 0xd;
        }
        break;
      case 0xe:
        uVar12 = 0xe;
        if (0x19 < (byte)(cVar1 + 0xbfU)) {
          bVar15 = 9 < (byte)(cVar1 - 0x30U);
          if (cVar1 != '_' && bVar15) {
            local_70 = current;
          }
          bVar15 = cVar1 != '_' && bVar15;
          uVar12 = (uint)bVar15 + (uint)bVar15 * 2 + 0xe;
        }
        break;
      case 0xf:
        _Var8 = bc_isspace(iVar14);
        uVar12 = 0xf;
        if (!_Var8) {
          if (0x19 < (byte)(cVar1 + 0xbfU)) {
            pcVar13 = "Invalid foreach variable name. Must begin with uppercase letter.";
            goto LAB_001058bf;
          }
          uVar12 = 0x10;
          local_c0 = current;
        }
        break;
      case 0x10:
        uVar12 = 0x10;
        if ((0x19 < (byte)(cVar1 + 0xbfU)) && (cVar1 != '_' && 9 < (byte)(cVar1 - 0x30U))) {
          _Var8 = bc_isspace(iVar14);
          if (!_Var8) {
            pcVar13 = "Invalid foreach variable name. Must be uppercase letter, number or \'_\'.";
            goto LAB_001058bf;
          }
          uVar12 = 0x11;
          local_a0 = current;
        }
        break;
      case 0x11:
        _Var8 = bc_isspace(iVar14);
        uVar12 = 0x11;
        if (!_Var8) {
          if (cVar1 == '%') goto LAB_001052c9;
          if (cVar1 != '-') goto LAB_00105014;
          uVar12 = 0x12;
          bVar3 = true;
        }
        break;
      case 0x12:
        if (cVar1 == '-') {
          pcVar13 = "Invalid statement syntax. Duplicated whitespace cleaner after statement.";
        }
        else {
          if (cVar1 == '%') goto LAB_001052c9;
LAB_00105014:
          pcVar13 = "Invalid statement syntax. Must end with \'%%}\'.";
        }
        pbVar11 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,current,pcVar13);
        *err = pbVar11;
        uVar12 = 0x12;
        break;
      case 0x13:
        _Var8 = bc_isspace(iVar14);
        uVar12 = 0x13;
        if (!_Var8) {
          if (0x19 < (byte)(cVar1 + 0xbfU)) goto LAB_00105290;
          local_c4 = 10;
          uVar12 = 0x14;
          local_c0 = current;
        }
        break;
      case 0x14:
        uVar12 = 0x14;
        if ((0x19 < (byte)(cVar1 + 0xbfU)) && (cVar1 != '_' && 9 < (byte)(cVar1 - 0x30U))) {
          _Var8 = bc_isspace(iVar14);
          if (!_Var8) {
            sVar7 = current;
            if (cVar1 != '}') goto LAB_001054e7;
            goto LAB_001052c9;
          }
          uVar12 = 0x15;
          local_a0 = current;
        }
        break;
      case 0x15:
        _Var8 = bc_isspace(iVar14);
        uVar12 = 0x15;
        if (!_Var8) {
          if (cVar1 != '}') {
            pcVar13 = "Invalid statement syntax. Must end with \'}}\'.";
            goto LAB_001058bf;
          }
LAB_001052c9:
          local_a0 = sVar7;
          uVar12 = 0x16;
        }
        break;
      case 0x16:
        if (cVar1 != '}') {
          pbVar11 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,current,
                                    "Invalid statement syntax. Must end with \'}\'.");
          *err = pbVar11;
          goto LAB_001052c9;
        }
        iVar14 = 0;
        if (local_b0 < local_90) {
          if (local_90 - local_b0 == 2) {
            bVar2 = src[local_b0];
            if (bVar2 == 0x3e) {
              if (src[local_b0 + 1] != '=') goto LAB_00105915;
              iVar14 = 10;
            }
            else if (bVar2 == 0x3d) {
              if (src[local_b0 + 1] != '=') goto LAB_00105915;
              iVar14 = 2;
            }
            else if (bVar2 == 0x3c) {
              if (src[local_b0 + 1] != '=') goto LAB_00105915;
              iVar14 = 6;
            }
            else {
              iVar14 = bVar2 - 0x21;
              if (iVar14 == 0) {
                iVar14 = 0x3d - (uint)(byte)src[local_b0 + 1];
              }
              else {
                iVar14 = -iVar14;
              }
              if (iVar14 != 0) goto LAB_00105915;
              iVar14 = 1;
            }
          }
          else {
            if (local_90 - local_b0 != 1) {
LAB_00105915:
              pbVar11 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,local_b0,
                                        "Invalid \'if\' operator. Must be \'<\', \'>\', \'<=\', \'>=\', \'==\' or \'!=\'."
                                       );
              *err = pbVar11;
              uVar12 = 0x16;
              goto LAB_0010593b;
            }
            if (src[local_b0] == '<') {
              iVar14 = 4;
            }
            else {
              if (src[local_b0] != '>') goto LAB_00105915;
              iVar14 = 8;
            }
          }
          local_b0 = 0;
          local_90 = 0;
        }
        local_58 = (int *)bc_malloc(0x20);
        *local_58 = local_c4;
        local_58[1] = iVar14;
        local_58[2] = 0;
        local_58[3] = 0;
        local_58[4] = 0;
        local_58[5] = 0;
        if (local_c0 <= local_a0 && local_a0 - local_c0 != 0) {
          pcVar13 = bc_strndup(src + local_c0,local_a0 - local_c0);
          *(char **)(local_58 + 2) = pcVar13;
        }
        if (local_60 <= local_70 && local_70 - local_60 != 0) {
          pcVar13 = bc_strndup(src + local_60,local_70 - local_60);
          *(char **)(local_58 + 4) = pcVar13;
          local_60 = 0;
          local_70 = 0;
        }
        if (local_c4 == 8) {
          local_40 = *(undefined8 *)(local_58 + 2);
        }
        local_88 = bc_slist_append(local_88,local_58);
        local_c4 = 0xb;
        uVar12 = 1;
        local_c0 = current + 1;
      }
LAB_001058c9:
      current = current + 1;
    } while (*err == (bc_error_t *)0x0);
    blogc_template_free_ast(local_88);
  }
  return (bc_slist_t *)0x0;
}

Assistant:

bc_slist_t*
blogc_template_parse(const char *src, size_t src_len, bc_error_t **err)
{
    if (err == NULL || *err != NULL)
        return NULL;

    size_t current = 0;
    size_t start = 0;
    size_t end = 0;
    size_t op_start = 0;
    size_t op_end = 0;
    size_t start2 = 0;
    size_t end2 = 0;

    blogc_template_operator_t tmp_op = 0;

    size_t if_count = 0;
    size_t block_if_count = 0;
    bool else_open = false;
    bool foreach_open = false;
    bool block_foreach_open = false;

    bc_slist_t *ast = NULL;
    blogc_template_node_t *node = NULL;

    /*
     * this is a reference to the content of previous node in the singly-linked
     * list. The "correct" solution here would be implement a doubly-linked
     * list, but here are a few reasons to avoid it:
     *
     * - i'm too tired to implement it :P
     * - template parser never walk backwards, then the list itself does not
     *   need to know its previous node.
     */
    blogc_template_node_t *previous = NULL;

    bool lstrip_next = false;
    char *tmp = NULL;
    char *block_type = NULL;

    blogc_template_parser_state_t state = TEMPLATE_START;
    blogc_template_node_type_t type = BLOGC_TEMPLATE_NODE_CONTENT;

    bool block_open = false;

    while (current < src_len) {
        char c = src[current];
        bool last = current == src_len - 1;

        switch (state) {

            case TEMPLATE_START:
                if (last) {
                    node = bc_malloc(sizeof(blogc_template_node_t));
                    node->type = type;
                    if (lstrip_next) {
                        tmp = bc_strndup(src + start, src_len - start);
                        node->data[0] = bc_strdup(bc_str_lstrip(tmp));
                        free(tmp);
                        tmp = NULL;
                        lstrip_next = false;
                    }
                    else {
                        node->data[0] = bc_strndup(src + start, src_len - start);
                    }
                    node->op = 0;
                    node->data[1] = NULL;
                    ast = bc_slist_append(ast, node);
                    previous = node;
                    node = NULL;
                }
                if (c == '{') {
                    end = current;
                    state = TEMPLATE_OPEN_BRACKET;
                }
                break;

            case TEMPLATE_OPEN_BRACKET:
                if (c == '%' || c == '{') {
                    if (c == '%')
                        state = TEMPLATE_BLOCK_START_WHITESPACE_CLEANER;
                    else
                        state = TEMPLATE_VARIABLE_START;
                    if (end > start) {
                        node = bc_malloc(sizeof(blogc_template_node_t));
                        node->type = type;
                        if (lstrip_next) {
                            tmp = bc_strndup(src + start, end - start);
                            node->data[0] = bc_strdup(bc_str_lstrip(tmp));
                            free(tmp);
                            tmp = NULL;
                            lstrip_next = false;
                        }
                        else {
                            node->data[0] = bc_strndup(src + start, end - start);
                        }
                        node->op = 0;
                        node->data[1] = NULL;
                        ast = bc_slist_append(ast, node);
                        previous = node;
                        node = NULL;
                    }
                    break;
                }
                state = TEMPLATE_START;
                break;

            case TEMPLATE_BLOCK_START_WHITESPACE_CLEANER:
                if (c == '-') {
                    if ((previous != NULL) &&
                        (previous->type == BLOGC_TEMPLATE_NODE_CONTENT))
                    {
                        previous->data[0] = bc_str_rstrip(previous->data[0]);  // does not need copy
                    }
                    state = TEMPLATE_BLOCK_START;
                    break;
                }
                state = TEMPLATE_BLOCK_START;

            case TEMPLATE_BLOCK_START:
                if (bc_isspace(c))
                    break;
                if (c >= 'a' && c <= 'z') {
                    state = TEMPLATE_BLOCK_TYPE;
                    start = current;
                    break;
                }
                if (c == '-') {
                    *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                        src_len, current,
                        "Invalid statement syntax. Duplicated whitespace "
                        "cleaner before statement.");
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid statement syntax. Must begin with lowercase letter.");
                break;

            case TEMPLATE_BLOCK_TYPE:
                if (c >= 'a' && c <= 'z')
                    break;
                if (bc_isspace(c)) {
                    if ((current - start == 5) &&
                        (0 == strncmp("block", src + start, 5)))
                    {
                        if (!block_open) {
                            state = TEMPLATE_BLOCK_BLOCK_TYPE_START;
                            type = BLOGC_TEMPLATE_NODE_BLOCK;
                            start = current;
                            block_if_count = if_count;
                            block_foreach_open = foreach_open;
                            break;
                        }
                        *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,
                            src, src_len, current, "Blocks can't be nested.");
                        break;
                    }
                    else if ((current - start == 8) &&
                        (0 == strncmp("endblock", src + start, 8)))
                    {
                        if (block_open) {
                            if (if_count != block_if_count) {
                                *err = bc_error_new_printf(BLOGC_ERROR_TEMPLATE_PARSER,
                                    "%d open 'if', 'ifdef' and/or 'ifndef' statements "
                                    "were not closed inside a '%s' block!",
                                    if_count - block_if_count, block_type);
                                break;
                            }
                            if (!block_foreach_open && foreach_open) {
                                *err = bc_error_new_printf(BLOGC_ERROR_TEMPLATE_PARSER,
                                    "An open 'foreach' statement was not closed "
                                    "inside a '%s' block!", block_type);
                                break;
                            }
                            state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                            type = BLOGC_TEMPLATE_NODE_ENDBLOCK;
                            block_open = false;
                            break;
                        }
                        *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,
                            src, src_len, current,
                            "'endblock' statement without an open 'block' statement.");
                        break;
                    }
                    else if ((current - start == 5) &&
                        (0 == strncmp("ifdef", src + start, 5)))
                    {
                        state = TEMPLATE_BLOCK_IF_START;
                        type = BLOGC_TEMPLATE_NODE_IFDEF;
                        start = current;
                        if_count++;
                        else_open = false;
                        break;
                    }
                    else if ((current - start == 6) &&
                        (0 == strncmp("ifndef", src + start, 6)))
                    {
                        state = TEMPLATE_BLOCK_IF_START;
                        type = BLOGC_TEMPLATE_NODE_IFNDEF;
                        start = current;
                        if_count++;
                        else_open = false;
                        break;
                    }
                    else if ((current - start == 2) &&
                        (0 == strncmp("if", src + start, 2)))
                    {
                        state = TEMPLATE_BLOCK_IF_START;
                        type = BLOGC_TEMPLATE_NODE_IF;
                        start = current;
                        if_count++;
                        else_open = false;
                        break;
                    }
                    else if ((current - start == 4) &&
                        (0 == strncmp("else", src + start, 4)))
                    {
                        if ((block_open && if_count > block_if_count) ||
                            (!block_open && if_count > 0))
                        {
                            if (!else_open) {
                                state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                                type = BLOGC_TEMPLATE_NODE_ELSE;
                                else_open = true;
                                break;
                            }
                            *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,
                                src, src_len, current,
                                "More than one 'else' statement for an open 'if', "
                                "'ifdef' or 'ifndef' statement.");
                            break;
                        }
                        *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,
                            src, src_len, current,
                            "'else' statement without an open 'if', 'ifdef' or "
                            "'ifndef' statement.");
                        break;
                    }
                    else if ((current - start == 5) &&
                        (0 == strncmp("endif", src + start, 5)))
                    {
                        if ((block_open && if_count > block_if_count) ||
                            (!block_open && if_count > 0))
                        {
                            state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                            type = BLOGC_TEMPLATE_NODE_ENDIF;
                            if_count--;
                            else_open = false;
                            break;
                        }
                        *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,
                            src, src_len, current,
                            "'endif' statement without an open 'if', 'ifdef' or "
                            "'ifndef' statement.");
                        break;
                    }
                    else if ((current - start == 7) &&
                        (0 == strncmp("foreach", src + start, 7)))
                    {
                        if (!foreach_open) {
                            state = TEMPLATE_BLOCK_FOREACH_START;
                            type = BLOGC_TEMPLATE_NODE_FOREACH;
                            start = current;
                            foreach_open = true;
                            break;
                        }
                        *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,
                            src, src_len, current, "'foreach' statements can't "
                            "be nested.");
                        break;
                    }
                    else if ((current - start == 10) &&
                        (0 == strncmp("endforeach", src + start, 10)))
                    {
                        if ((block_open && !block_foreach_open && foreach_open) ||
                            (!block_open && foreach_open))
                        {
                            state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                            type = BLOGC_TEMPLATE_NODE_ENDFOREACH;
                            foreach_open = false;
                            break;
                        }
                        *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,
                            src, src_len, current,
                            "'endforeach' statement without an open 'foreach' "
                            "statement.");
                        break;
                    }
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid statement type: Allowed types are: 'block', "
                    "'endblock', 'if', 'ifdef', 'ifndef', 'else', 'endif', "
                    "'foreach' and 'endforeach'.");
                break;

            case TEMPLATE_BLOCK_BLOCK_TYPE_START:
                if (bc_isspace(c))
                    break;
                if (c >= 'a' && c <= 'z') {
                    state = TEMPLATE_BLOCK_BLOCK_TYPE;
                    start = current;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid block syntax. Must begin with lowercase letter.");
                break;

            case TEMPLATE_BLOCK_BLOCK_TYPE:
                if ((c >= 'a' && c <= 'z') || c == '_')
                    break;
                if (bc_isspace(c)) {
                    if ((current - start == 5) &&
                        (0 == strncmp("entry", src + start, 5)))
                    {
                        block_open = true;
                        end = current;
                        state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                        break;
                    }
                    else if ((current - start == 7) &&
                        (0 == strncmp("listing", src + start, 7)))
                    {
                        block_open = true;
                        end = current;
                        state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                        break;
                    }
                    else if ((current - start == 12) &&
                        (0 == strncmp("listing_once", src + start, 12)))
                    {
                        block_open = true;
                        end = current;
                        state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                        break;
                    }
                    else if ((current - start == 13) &&
                        (0 == strncmp("listing_empty", src + start, 13)))
                    {
                        block_open = true;
                        end = current;
                        state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                        break;
                    }
                    else if ((current - start == 13) &&
                        (0 == strncmp("listing_entry", src + start, 13)))
                    {
                        block_open = true;
                        end = current;
                        state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                        break;
                    }
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid block type. Allowed types are: 'entry', 'listing', "
                    "'listing_once', 'listing_empty' and 'listing_entry'.");
                break;

            case TEMPLATE_BLOCK_IF_START:
                if (bc_isspace(c))
                    break;
                if (c >= 'A' && c <= 'Z') {
                    state = TEMPLATE_BLOCK_IF_VARIABLE;
                    start = current;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid variable name. Must begin with uppercase letter.");
                break;

            case TEMPLATE_BLOCK_IF_VARIABLE:
                if ((c >= 'A' && c <= 'Z') || (c >= '0' && c <= '9') || c == '_')
                    break;
                if (bc_isspace(c)) {
                    end = current;
                    if (type == BLOGC_TEMPLATE_NODE_IF)
                        state = TEMPLATE_BLOCK_IF_OPERATOR_START;
                    else
                        state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid variable name. Must be uppercase letter, number "
                    "or '_'.");
                break;

            case TEMPLATE_BLOCK_IF_OPERATOR_START:
                if (bc_isspace(c))
                    break;
                state = TEMPLATE_BLOCK_IF_OPERATOR;
                op_start = current;
                break;

            case TEMPLATE_BLOCK_IF_OPERATOR:
                if (!bc_isspace(c))
                    break;
                state = TEMPLATE_BLOCK_IF_OPERAND_START;
                op_end = current;
                break;

            case TEMPLATE_BLOCK_IF_OPERAND_START:
                if (bc_isspace(c))
                    break;
                if (c >= 'A' && c <= 'Z') {
                    state = TEMPLATE_BLOCK_IF_VARIABLE_OPERAND;
                    start2 = current;
                    break;
                }
                if (c == '"') {
                    state = TEMPLATE_BLOCK_IF_STRING_OPERAND;
                    start2 = current;
                    break;
                }
                op_start = 0;
                op_end = 0;
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid 'if' operand. Must be double-quoted static "
                    "string or variable.");
                break;

            case TEMPLATE_BLOCK_IF_STRING_OPERAND:
                if (c != '"')
                    break;
                if (c == '"' && src[current - 1] == '\\')
                    break;
                state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                end2 = current + 1;
                break;

           case TEMPLATE_BLOCK_IF_VARIABLE_OPERAND:
                if ((c >= 'A' && c <= 'Z') || (c >= '0' && c <= '9') || c == '_')
                    break;
                state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                end2 = current;
                break;

            case TEMPLATE_BLOCK_FOREACH_START:
                if (bc_isspace(c))
                    break;
                if (c >= 'A' && c <= 'Z') {
                    state = TEMPLATE_BLOCK_FOREACH_VARIABLE;
                    start = current;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid foreach variable name. Must begin with uppercase "
                    "letter.");
                break;

            case TEMPLATE_BLOCK_FOREACH_VARIABLE:
                if ((c >= 'A' && c <= 'Z') || (c >= '0' && c <= '9') || c == '_')
                    break;
                if (bc_isspace(c)) {
                    end = current;
                    state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid foreach variable name. Must be uppercase letter, "
                    "number or '_'.");
                break;

            case TEMPLATE_BLOCK_END_WHITESPACE_CLEANER:
                if (bc_isspace(c))
                    break;
                if (c == '-') {
                    lstrip_next = true;
                    state = TEMPLATE_BLOCK_END;
                    break;
                }
                state = TEMPLATE_BLOCK_END;

            case TEMPLATE_BLOCK_END:
                if (c == '%') {
                    state = TEMPLATE_CLOSE_BRACKET;
                    break;
                }
                if (c == '-') {
                    *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                        src_len, current,
                        "Invalid statement syntax. Duplicated whitespace "
                        "cleaner after statement.");
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid statement syntax. Must end with '%%}'.");
                break;

            case TEMPLATE_VARIABLE_START:
                if (bc_isspace(c))
                    break;
                if (c >= 'A' && c <= 'Z') {
                    state = TEMPLATE_VARIABLE;
                    type = BLOGC_TEMPLATE_NODE_VARIABLE;
                    start = current;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid variable name. Must begin with uppercase letter.");
                break;

            case TEMPLATE_VARIABLE:
                if ((c >= 'A' && c <= 'Z') || (c >= '0' && c <= '9') || c == '_')
                    break;
                if (bc_isspace(c)) {
                    end = current;
                    state = TEMPLATE_VARIABLE_END;
                    break;
                }
                if (c == '}') {
                    end = current;
                    state = TEMPLATE_CLOSE_BRACKET;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid variable name. Must be uppercase letter, number "
                    "or '_'.");
                break;

            case TEMPLATE_VARIABLE_END:
                if (bc_isspace(c))
                    break;
                if (c == '}') {
                    state = TEMPLATE_CLOSE_BRACKET;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid statement syntax. Must end with '}}'.");
                break;

            case TEMPLATE_CLOSE_BRACKET:
                if (c == '}') {
                    tmp_op = 0;
                    if (op_end > op_start) {
                        if (op_end - op_start == 1) {
                            if (0 == strncmp("<", src + op_start, 1))
                                tmp_op = BLOGC_TEMPLATE_OP_LT;
                            else if (0 == strncmp(">", src + op_start, 1))
                                tmp_op = BLOGC_TEMPLATE_OP_GT;
                        }
                        else if (op_end - op_start == 2) {
                            if (0 == strncmp("<=", src + op_start, 2))
                                tmp_op = BLOGC_TEMPLATE_OP_LT | BLOGC_TEMPLATE_OP_EQ;
                            else if (0 == strncmp(">=", src + op_start, 2))
                                tmp_op = BLOGC_TEMPLATE_OP_GT | BLOGC_TEMPLATE_OP_EQ;
                            else if (0 == strncmp("==", src + op_start, 2))
                                tmp_op = BLOGC_TEMPLATE_OP_EQ;
                            else if (0 == strncmp("!=", src + op_start, 2))
                                tmp_op = BLOGC_TEMPLATE_OP_NEQ;
                        }
                        if (tmp_op == 0) {
                            *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,
                                src, src_len, op_start,
                                "Invalid 'if' operator. Must be '<', '>', "
                                "'<=', '>=', '==' or '!='.");
                            op_start = 0;
                            op_end = 0;
                            break;
                        }
                        op_start = 0;
                        op_end = 0;
                    }
                    node = bc_malloc(sizeof(blogc_template_node_t));
                    node->type = type;
                    node->op = tmp_op;
                    node->data[0] = NULL;
                    node->data[1] = NULL;
                    if (end > start)
                        node->data[0] = bc_strndup(src + start, end - start);
                    if (end2 > start2) {
                        node->data[1] = bc_strndup(src + start2, end2 - start2);
                        start2 = 0;
                        end2 = 0;
                    }
                    if (type == BLOGC_TEMPLATE_NODE_BLOCK)
                        block_type = node->data[0];
                    ast = bc_slist_append(ast, node);
                    previous = node;
                    node = NULL;
                    state = TEMPLATE_START;
                    type = BLOGC_TEMPLATE_NODE_CONTENT;
                    start = current + 1;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid statement syntax. Must end with '}'.");
                break;

        }

        if (*err != NULL)
            break;

        current++;
    }

    if (*err == NULL) {
        if (state == TEMPLATE_BLOCK_IF_STRING_OPERAND)
            *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src, src_len,
                start2, "Found an open double-quoted string.");
        else if (if_count != 0)
            *err = bc_error_new_printf(BLOGC_ERROR_TEMPLATE_PARSER,
                "%d open 'if', 'ifdef' and/or 'ifndef' statements were not closed!",
                if_count);
        else if (block_open)
            *err = bc_error_new(BLOGC_ERROR_TEMPLATE_PARSER,
                "An open block was not closed!");
        else if (foreach_open)
            *err = bc_error_new(BLOGC_ERROR_TEMPLATE_PARSER,
                "An open 'foreach' statement was not closed!");
    }

    if (*err != NULL) {
        if (node != NULL) {
            free(node->data[0]);
            free(node);
        }
        blogc_template_free_ast(ast);
        return NULL;
    }

    return ast;
}